

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall soul::Module::StateVariables::clear(StateVariables *this)

{
  pool_ref<soul::heart::Variable> *ppVar1;
  
  (this->stateVariables).numActive = 0;
  if (0x20 < (this->stateVariables).numAllocated) {
    ppVar1 = (this->stateVariables).items;
    if (ppVar1 != (pool_ref<soul::heart::Variable> *)0x0) {
      operator_delete__(ppVar1);
    }
    (this->stateVariables).items = (pool_ref<soul::heart::Variable> *)(this->stateVariables).space;
    (this->stateVariables).numAllocated = 0x20;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }